

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.cpp
# Opt level: O1

void __thiscall Refal2::CQualifier::printChars(CQualifier *this,ostream *outputStream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pcVar3;
  CQualifier *pCVar4;
  bool bVar5;
  size_t __i;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  size_t __result_4;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  int i;
  size_t __position;
  set<char,_std::less<char>,_std::allocator<char>_> a;
  CAnsiSet other;
  CAnsiSet D;
  CAnsiSet L;
  undefined1 local_b8 [32];
  _Rb_tree_node_base *local_98;
  size_t local_90;
  string local_88;
  pointer local_68;
  _WordT _Stack_60;
  CQualifier *local_58;
  CAnsiSet local_50;
  CAnsiSet local_40;
  
  local_b8._0_8_ = (pointer)(this->ansichars).super__Base_bitset<2UL>._M_w[0];
  local_b8._8_8_ = (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  lVar6 = 0;
  do {
    *(ulong *)(local_b8 + lVar6 * 8) =
         *(ulong *)(local_b8 + lVar6 * 8) & (ulong)(&CQualifierBuilder::AnsiL)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_40.super__Base_bitset<2UL>._M_w[0] = local_b8._0_8_;
  local_40.super__Base_bitset<2UL>._M_w[1] = local_b8._8_8_;
  local_b8._0_8_ = (pointer)(this->ansichars).super__Base_bitset<2UL>._M_w[0];
  local_b8._8_8_ = (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  lVar6 = 0;
  do {
    *(ulong *)(local_b8 + lVar6 * 8) =
         *(ulong *)(local_b8 + lVar6 * 8) & (&CQualifierBuilder::AnsiD)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_50.super__Base_bitset<2UL>._M_w[0] = local_b8._0_8_;
  local_50.super__Base_bitset<2UL>._M_w[1] = local_b8._8_8_;
  std::__cxx11::string::string
            ((string *)local_b8,CQualifierBuilder::Alphabet,(allocator *)&local_68);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"L","");
  printAnsiSet(outputStream,&local_40,(string *)local_b8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_);
  }
  std::__cxx11::string::string((string *)local_b8,CQualifierBuilder::Numbers,(allocator *)&local_68)
  ;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"D","");
  printAnsiSet(outputStream,&local_50,(string *)local_b8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_);
  }
  local_b8._0_8_ = local_40.super__Base_bitset<2UL>._M_w[0];
  local_b8._8_8_ = local_40.super__Base_bitset<2UL>._M_w[1];
  lVar6 = 0;
  do {
    *(ulong *)(local_b8 + lVar6 * 8) =
         *(ulong *)(local_b8 + lVar6 * 8) | local_50.super__Base_bitset<2UL>._M_w[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  lVar6 = 0;
  do {
    *(ulong *)(local_b8 + lVar6 * 8) = ~*(ulong *)(local_b8 + lVar6 * 8);
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_68 = (pointer)local_b8._0_8_;
  _Stack_60 = local_b8._8_8_;
  local_b8._0_8_ = (pointer)(this->ansichars).super__Base_bitset<2UL>._M_w[0];
  local_b8._8_8_ = (this->ansichars).super__Base_bitset<2UL>._M_w[1];
  lVar6 = 0;
  do {
    *(ulong *)(local_b8 + lVar6 * 8) = *(ulong *)(local_b8 + lVar6 * 8) & (ulong)(&local_68)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_88._M_dataplus._M_p = (pointer)local_b8._0_8_;
  local_88._M_string_length = local_b8._8_8_;
  lVar6 = 0;
  uVar8 = 0;
  do {
    pcVar3 = (&local_88._M_dataplus)[lVar6]._M_p;
    uVar10 = (long)pcVar3 - ((ulong)pcVar3 >> 1 & 0x5555555555555555);
    uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
    uVar8 = uVar8 + (((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  local_58 = this;
  if (0x1e < uVar8) {
    local_b8._0_8_ = CQualifierBuilder::AnsiL;
    local_b8._8_8_ = DAT_001492f8;
    lVar6 = 0;
    do {
      *(ulong *)(local_b8 + lVar6 * 8) =
           *(ulong *)(local_b8 + lVar6 * 8) | (&CQualifierBuilder::AnsiD)[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    lVar6 = 0;
    do {
      (&local_88._M_dataplus)[lVar6]._M_p =
           (pointer)((ulong)(&local_88._M_dataplus)[lVar6]._M_p | *(ulong *)(local_b8 + lVar6 * 8));
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"(",1);
  }
  __position = 1;
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
  do {
    bVar5 = std::bitset<128UL>::test((bitset<128UL> *)&local_88,__position);
    if (bVar5 == uVar8 < 0x1f) {
      local_b8[0] = (char)__position;
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,local_b8,1);
    }
    __position = __position + 1;
  } while (__position != 0x80);
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\' ",2);
  if (0x1e < uVar8) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,")",1);
  }
  pCVar4 = local_58;
  if (((local_58->flags & 2) != 0) && ((local_58->chars).elementsSize != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"(",1);
  }
  if ((pCVar4->chars).elementsSize != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
  }
  p_Var2 = (_Rb_tree_node_base *)(local_b8 + 8);
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
  local_b8._16_8_ = 0;
  local_90 = 0;
  local_b8._24_8_ = p_Var2;
  local_98 = p_Var2;
  CFastSet<char>::GetSet(&pCVar4->chars,(CSet *)local_b8);
  if ((_Rb_tree_node_base *)local_b8._24_8_ != p_Var2) {
    p_Var7 = (_Rb_tree_node_base *)local_b8._24_8_;
    do {
      local_68 = (pointer)CONCAT71(local_68._1_7_,(char)p_Var7[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,(char *)&local_68,1);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var2);
  }
  if ((pCVar4->chars).elementsSize != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
  }
  if (((pCVar4->flags & 2) != 0) && ((pCVar4->chars).elementsSize != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,") ",2);
  }
  bVar5 = (pCVar4->flags & 2) == 0;
  pcVar9 = "O ";
  if (bVar5) {
    pcVar9 = "(O) ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,pcVar9,(ulong)bVar5 * 2 + 2);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
             local_b8);
  return;
}

Assistant:

void CQualifier::printChars( std::ostream& outputStream ) const
{
	CAnsiSet L = ansichars & CQualifierBuilder::AnsiL;
	CAnsiSet D = ansichars & CQualifierBuilder::AnsiD;

	printAnsiSet( outputStream, L, CQualifierBuilder::Alphabet, "L" );
	printAnsiSet( outputStream, D, CQualifierBuilder::Numbers, "D" );

	CAnsiSet other = ansichars & ~(L | D);
	bool superFlag = other.count() < 31;
	if( !superFlag ) {
		other |= CQualifierBuilder::AnsiL | CQualifierBuilder::AnsiD;
		outputStream << "(";
	}
	outputStream << "'";
	for( int i = 1; i < AnsiSetSize; i++ ) {
		if( other.test( i ) == superFlag ) {
			outputStream << static_cast<char>( i );
		}
	}
	outputStream << "' ";
	if( !superFlag ) {
		outputStream << ")";
	}

	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << "(";
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	std::set<TChar> a;
	chars.GetSet( &a );
	for( std::set<TChar>::const_iterator i = a.begin(); i != a.end(); ++i ) {
		outputStream << *i;
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << ") ";
	}

	if( IsIncludeAllChars() ) {
		outputStream << "O ";
	} else {
		outputStream << "(O) ";
	}
}